

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iota_suite.cpp
# Opt level: O0

void test_array_real(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_208;
  iterator local_1f0;
  iterator local_1d8;
  iterator local_1c0;
  iterator local_1a8;
  basic_variable<std::allocator<char>_> *local_190;
  basic_variable<std::allocator<char>_> local_188;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 local_c8 [24];
  variable result;
  iterator local_80;
  iterator local_58;
  nullable local_3c;
  undefined1 local_38 [8];
  variable data;
  
  local_3c = null;
  trial::dynamic::basic_array<std::allocator<char>_>::repeat<trial::dynamic::nullable>
            ((basic_variable<std::allocator<char>_> *)local_38,4,&local_3c);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_58,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_80,(basic_variable<std::allocator<char>_> *)local_38);
  std::iota<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
            (&local_58,&local_80,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_58);
  local_190 = &local_188;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_190,1.0);
  local_190 = &local_158;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_190,2.0);
  local_190 = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_190,3.0);
  local_190 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_190,4.0);
  local_c8._0_8_ = &local_188;
  local_c8._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_c8._0_8_,init);
  local_208 = (basic_variable<std::allocator<char>_> *)local_c8;
  do {
    local_208 = local_208 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_208);
  } while (local_208 != &local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1a8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d8,(basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f0,(basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/iota_suite.cpp"
             ,0x32,"void test_array_real()",&local_1a8,&local_1c0,&local_1d8,&local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void test_array_real()
{
    variable data = array::repeat(4, null);
    std::iota(data.begin(), data.end(), 1.0);
    variable result = array::make({ 1.0, 2.0, 3.0, 4.0 });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                 result.begin(), result.end(),
                                 std::equal_to<variable>());
}